

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

void Bac_NtkCollapse_rec(Bac_Ntk_t *pNew,Bac_Ntk_t *p,Vec_Int_t *vSigs)

{
  Vec_Int_t *p_00;
  ulong uVar1;
  Vec_Int_t *p_01;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  Bac_Ntk_t *p_02;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int local_50;
  
  iVar14 = (p->vType).nCap;
  lVar10 = (long)iVar14;
  if (lVar10 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                  ,0xfe,"void Bac_NtkStartCopies(Bac_Ntk_t *)");
  }
  p_01 = &p->vCopy;
  if ((p->vCopy).nCap < iVar14) {
    piVar7 = (p->vCopy).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(lVar10 * 4);
    }
    else {
      piVar7 = (int *)realloc(piVar7,lVar10 * 4);
    }
    (p->vCopy).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_01->nCap = iVar14;
  }
  if (0 < iVar14) {
    memset((p->vCopy).pArray,0xff,lVar10 << 2);
  }
  (p->vCopy).nSize = iVar14;
  if (vSigs->nSize != (p->vInputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Bac_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacNtk.c"
                  ,0x210,"void Bac_NtkCollapse_rec(Bac_Ntk_t *, Bac_Ntk_t *, Vec_Int_t *)");
  }
  if (0 < vSigs->nSize) {
    lVar10 = 0;
    do {
      if (vSigs->nSize <= lVar10) goto LAB_003b6aaf;
      uVar13 = (p->vInputs).pArray[lVar10];
      if (((int)uVar13 < 0) || ((p->vCopy).nSize <= (int)uVar13)) goto LAB_003b6aaf;
      if ((p->vCopy).pArray[uVar13] != -1) {
LAB_003b6b2b:
        __assert_fail("Bac_ObjCopy(p, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
      }
      Vec_IntSetEntry(p_01,uVar13,vSigs->pArray[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vInputs).nSize);
  }
  uVar13 = (p->vType).nSize;
  uVar16 = (ulong)uVar13;
  if (0 < (int)uVar13) {
    p_00 = &pNew->vFanin;
    lVar17 = 1;
    lVar10 = 0;
    do {
      pcVar8 = (p->vType).pArray;
      bVar3 = pcVar8[lVar10];
      if ((bVar3 >> 1) - 5 < 0x44) {
        uVar13 = (uint)uVar16;
        if ((bVar3 & 0xfe) == 10) {
          if (lVar10 + 1 < (long)(int)uVar13) {
            bVar3 = (p->vType).pArray[lVar17];
            lVar18 = lVar17;
            while ((bVar3 & 0xfe) == 8) {
              uVar13 = (pNew->vType).nSize;
              if (uVar13 != (pNew->vFanin).nSize) {
LAB_003b6aed:
                __assert_fail("iObj == Vec_IntSize(&p->vFanin)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                              ,0x19f,"int Bac_ObjAlloc(Bac_Ntk_t *, Bac_ObjType_t, int)");
              }
              if (uVar13 == (pNew->vType).nCap) {
                if ((int)uVar13 < 0x10) {
                  pcVar8 = (pNew->vType).pArray;
                  if (pcVar8 == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pcVar8,0x10);
                  }
                  (pNew->vType).pArray = pcVar8;
                  (pNew->vType).nCap = 0x10;
                }
                else {
                  sVar5 = (ulong)uVar13 * 2;
                  pcVar8 = (pNew->vType).pArray;
                  if (pcVar8 == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar5);
                  }
                  else {
                    pcVar8 = (char *)realloc(pcVar8,sVar5);
                  }
                  (pNew->vType).pArray = pcVar8;
                  (pNew->vType).nCap = (int)sVar5;
                }
              }
              else {
                pcVar8 = (pNew->vType).pArray;
              }
              iVar14 = (pNew->vType).nSize;
              (pNew->vType).nSize = iVar14 + 1;
              pcVar8[iVar14] = '\x06';
              Vec_IntPush(p_00,-1);
              uVar13 = (pNew->vType).nSize;
              if (uVar13 != (pNew->vFanin).nSize) goto LAB_003b6aed;
              if (uVar13 == (pNew->vType).nCap) {
                if ((int)uVar13 < 0x10) {
                  pcVar8 = (pNew->vType).pArray;
                  if (pcVar8 == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pcVar8,0x10);
                  }
                  (pNew->vType).pArray = pcVar8;
                  (pNew->vType).nCap = 0x10;
                }
                else {
                  sVar5 = (ulong)uVar13 * 2;
                  pcVar8 = (pNew->vType).pArray;
                  if (pcVar8 == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar5);
                  }
                  else {
                    pcVar8 = (char *)realloc(pcVar8,sVar5);
                  }
                  (pNew->vType).pArray = pcVar8;
                  (pNew->vType).nCap = (int)sVar5;
                }
              }
              else {
                pcVar8 = (pNew->vType).pArray;
              }
              iVar14 = (pNew->vType).nSize;
              (pNew->vType).nSize = iVar14 + 1;
              pcVar8[iVar14] = '\x14';
              Vec_IntPush(p_00,-1);
              uVar13 = (pNew->vType).nSize;
              if (uVar13 != (pNew->vFanin).nSize) goto LAB_003b6aed;
              if (uVar13 == (pNew->vType).nCap) {
                if ((int)uVar13 < 0x10) {
                  pcVar8 = (pNew->vType).pArray;
                  if (pcVar8 == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pcVar8,0x10);
                  }
                  (pNew->vType).pArray = pcVar8;
                  (pNew->vType).nCap = 0x10;
                }
                else {
                  sVar5 = (ulong)uVar13 * 2;
                  pcVar8 = (pNew->vType).pArray;
                  if (pcVar8 == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar5);
                  }
                  else {
                    pcVar8 = (char *)realloc(pcVar8,sVar5);
                  }
                  (pNew->vType).pArray = pcVar8;
                  (pNew->vType).nCap = (int)sVar5;
                }
              }
              else {
                pcVar8 = (pNew->vType).pArray;
              }
              iVar14 = (pNew->vType).nSize;
              (pNew->vType).nSize = iVar14 + 1;
              pcVar8[iVar14] = '\b';
              Vec_IntPush(p_00,-1);
              if ((p->vCopy).nSize <= lVar18) goto LAB_003b6aaf;
              if ((p->vCopy).pArray[lVar18] != -1) goto LAB_003b6b2b;
              Vec_IntSetEntry(p_01,(int)lVar18,uVar13);
              uVar13 = (p->vType).nSize;
              uVar16 = (ulong)uVar13;
              if ((int)uVar13 <= (int)lVar18 + 1) break;
              lVar12 = lVar18 + 1;
              lVar18 = lVar18 + 1;
              bVar3 = (p->vType).pArray[lVar12];
            }
          }
        }
        else {
          iVar14 = (int)lVar10;
          lVar18 = lVar10;
          do {
            lVar12 = lVar18;
            if (lVar12 < 1) {
              uVar9 = 0;
              goto LAB_003b650e;
            }
            if (uVar13 <= iVar14 - 1U) goto LAB_003b6a90;
            lVar18 = lVar12 + -1;
          } while ((pcVar8[lVar12 + -1] & 0xfeU) == 6);
          uVar9 = (uint)lVar12;
LAB_003b650e:
          if ((int)uVar13 <= (int)uVar9) goto LAB_003b6a90;
          uVar16 = (ulong)uVar9;
          while (((p->vType).pArray[uVar16] & 0xfeU) == 6) {
            Bac_ObjDup(pNew,p,(int)uVar16);
            uVar16 = uVar16 + 1;
            if ((p->vType).nSize <= (int)uVar16) goto LAB_003b6a90;
          }
          uVar13 = Bac_ObjDup(pNew,p,iVar14);
          if ((((p->vName).pArray != (int *)0x0) && ((pNew->vName).pArray != (int *)0x0)) &&
             (iVar6 = Bac_ObjName(p,iVar14), iVar6 != 0)) {
            iVar14 = Bac_ObjName(p,iVar14);
            iVar6 = Bac_ObjName(pNew,uVar13);
            if (iVar6 != 0) {
LAB_003b6bc6:
              __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                            ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
            }
            if (((int)uVar13 < 0) || ((pNew->vType).nSize <= (int)uVar13)) goto LAB_003b6a90;
            if (((pNew->vType).pArray[uVar13] & 0xfcU) == 4) goto LAB_003b6bc6;
            Vec_IntSetEntry(&pNew->vName,uVar13,iVar14);
          }
          uVar9 = (p->vType).nSize;
          uVar16 = (ulong)uVar9;
          lVar18 = (long)(int)uVar9;
          if (lVar18 <= lVar10) goto LAB_003b6a90;
          if (((byte)(p->vType).pArray[lVar10] >> 1) - 0x49 < 0xffffffbc) goto LAB_003b6b4a;
          if ((p->vFanin).nSize <= lVar10) goto LAB_003b6aaf;
          iVar14 = (p->vFanin).pArray[lVar10];
          if ((0 < (long)iVar14) && (iVar14 <= p->pDesign->nNtks)) {
            if (((int)uVar13 < 0) || ((pNew->vType).nSize <= (int)uVar13)) goto LAB_003b6a90;
            iVar14 = p->pDesign->pNtks[iVar14].iCopy;
            if (((iVar14 < 1) || (0x43 < ((byte)(pNew->vType).pArray[uVar13] >> 1) - 5)) ||
               (pNew->pDesign->nNtks < iVar14)) {
              __assert_fail("Bac_ObjIsBox(p, i)&&Bac_ManNtkIsOk(p->pDesign, x)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                            ,0x13e,"void Bac_BoxSetNtkId(Bac_Ntk_t *, int, int)");
            }
            Vec_IntSetEntry(p_00,uVar13,iVar14);
            uVar13 = (p->vType).nSize;
            uVar16 = (ulong)uVar13;
            lVar18 = (long)(int)uVar13;
          }
          lVar12 = lVar10;
          if (lVar10 + 1 < lVar18) {
            do {
              iVar14 = (int)lVar12;
              if (iVar14 < -1) goto LAB_003b6a90;
              if (((p->vType).pArray[lVar12 + 1] & 0xfeU) != 8) break;
              Bac_ObjDup(pNew,p,iVar14 + 1);
              uVar13 = (p->vType).nSize;
              uVar16 = (ulong)uVar13;
              lVar12 = lVar12 + 1;
            } while (iVar14 + 2 < (int)uVar13);
          }
        }
      }
      lVar10 = lVar10 + 1;
      lVar17 = lVar17 + 1;
    } while (lVar10 < (int)uVar16);
    if (0 < (int)uVar16) {
      uVar11 = 1;
      local_50 = -1;
      lVar10 = 0;
      do {
        iVar14 = (int)uVar16;
        bVar3 = (p->vType).pArray[lVar10];
        if ((bVar3 >> 1) - 5 < 0x44) {
          if ((bVar3 & 0xfe) == 10) {
            vSigs->nSize = 0;
            lVar17 = lVar10;
            if (lVar10 != 0) {
              do {
                iVar14 = (p->vType).nSize;
                if (iVar14 < (int)lVar17) goto LAB_003b6a90;
                if (((p->vType).pArray[lVar17 + -1] & 0xfeU) != 6) goto LAB_003b678e;
                if ((p->vFanin).nSize < (int)lVar17) goto LAB_003b6aaf;
                iVar14 = (p->vFanin).pArray[lVar17 + -1];
                if (((long)iVar14 < 0) || ((p->vCopy).nSize <= iVar14)) goto LAB_003b6aaf;
                lVar17 = lVar17 + -1;
                Vec_IntPush(vSigs,(p->vCopy).pArray[iVar14]);
              } while (lVar17 != 0);
              iVar14 = (p->vType).nSize;
            }
LAB_003b678e:
            if (iVar14 <= lVar10) goto LAB_003b6a90;
            if (((byte)(p->vType).pArray[lVar10] >> 1) - 0x49 < 0xffffffbc) {
LAB_003b6b4a:
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                            ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
            }
            if ((p->vFanin).nSize <= lVar10) goto LAB_003b6aaf;
            iVar14 = (p->vFanin).pArray[lVar10];
            if (((long)iVar14 < 1) || (p->pDesign->nNtks < iVar14)) {
              p_02 = (Bac_Ntk_t *)0x0;
            }
            else {
              p_02 = p->pDesign->pNtks + iVar14;
            }
            Bac_NtkCollapse_rec(pNew,p_02,vSigs);
            uVar13 = (p->vType).nSize;
            uVar16 = (ulong)uVar13;
            if ((int)uVar13 <= lVar10) goto LAB_003b6a90;
            pcVar8 = (p->vType).pArray;
            if (((byte)pcVar8[lVar10] >> 1) - 0x49 < 0xffffffbc) {
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                            ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
            }
            uVar15 = uVar11;
            iVar14 = local_50;
            do {
              iVar6 = uVar13 - 1;
              if (uVar16 <= uVar15) break;
              pbVar2 = (byte *)(pcVar8 + uVar15);
              iVar14 = iVar14 + 1;
              uVar15 = uVar15 + 1;
              iVar6 = iVar14;
            } while ((*pbVar2 & 0xfe) == 8);
            if (vSigs->nSize != iVar6 - (int)lVar10) {
              __assert_fail("Vec_IntSize(vSigs) == Bac_BoxBoNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacNtk.c"
                            ,0x22e,"void Bac_NtkCollapse_rec(Bac_Ntk_t *, Bac_Ntk_t *, Vec_Int_t *)"
                           );
            }
            if ((lVar10 + 1 < (long)(int)uVar13) && (((p->vType).pArray[uVar11] & 0xfeU) == 8)) {
              lVar17 = 0;
              uVar15 = uVar11;
              do {
                if (((long)(p->vCopy).nSize <= (long)uVar15) || (vSigs->nSize <= lVar17))
                goto LAB_003b6aaf;
                iVar14 = (p->vCopy).pArray[uVar15];
                if (iVar14 < 2) goto LAB_003b6a90;
                uVar13 = iVar14 - 2;
                if ((pNew->vType).nSize <= (int)uVar13) goto LAB_003b6a90;
                if (((pNew->vType).pArray[uVar13] & 0xfcU) != 4) goto LAB_003b6ace;
                if ((pNew->vFanin).nSize <= (int)uVar13) goto LAB_003b6aaf;
                if ((pNew->vFanin).pArray[uVar13] != -1) {
LAB_003b6b0c:
                  __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                                ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
                }
                Vec_IntSetEntry(p_00,uVar13,vSigs->pArray[lVar17]);
                uVar13 = (p->vType).nSize;
                uVar16 = (ulong)uVar13;
                if ((int)uVar13 <= (int)uVar15 + 1) break;
                lVar17 = lVar17 + 1;
                lVar18 = uVar15 + 1;
                uVar15 = uVar15 + 1;
              } while (((p->vType).pArray[lVar18] & 0xfeU) == 8);
            }
          }
          else {
            uVar15 = uVar11;
            if (lVar10 != 0) {
              do {
                uVar13 = (p->vType).nSize;
                uVar16 = (ulong)uVar13;
                uVar1 = uVar15 - 1;
                iVar14 = (int)uVar1;
                if ((int)uVar13 < iVar14) goto LAB_003b6a90;
                uVar13 = (int)uVar15 - 2;
                if (((p->vType).pArray[uVar13] & 0xfeU) != 6) goto LAB_003b69f6;
                uVar9 = (p->vCopy).nSize;
                if (((int)uVar9 < iVar14) || ((p->vFanin).nSize < iVar14)) goto LAB_003b6aaf;
                uVar4 = (p->vFanin).pArray[uVar13];
                if (((long)(int)uVar4 < 0) || (uVar9 <= uVar4)) goto LAB_003b6aaf;
                piVar7 = (p->vCopy).pArray;
                uVar13 = piVar7[uVar13];
                if (((int)uVar13 < 0) || ((pNew->vType).nSize <= (int)uVar13)) goto LAB_003b6a90;
                if (((pNew->vType).pArray[uVar13] & 0xfcU) != 4) goto LAB_003b6ace;
                if ((pNew->vFanin).nSize <= (int)uVar13) goto LAB_003b6aaf;
                if ((pNew->vFanin).pArray[uVar13] != -1) goto LAB_003b6b0c;
                Vec_IntSetEntry(p_00,uVar13,piVar7[(int)uVar4]);
                uVar15 = uVar1;
              } while (1 < (long)uVar1);
              uVar16 = (ulong)(uint)(p->vType).nSize;
            }
          }
        }
LAB_003b69f6:
        lVar10 = lVar10 + 1;
        uVar11 = uVar11 + 1;
        local_50 = local_50 + 1;
      } while (lVar10 < (int)uVar16);
    }
  }
  vSigs->nSize = 0;
  if (0 < (p->vOutputs).nSize) {
    lVar10 = 0;
    do {
      iVar14 = (p->vOutputs).pArray[lVar10];
      lVar17 = (long)iVar14;
      if ((lVar17 < 0) || ((p->vType).nSize <= iVar14)) {
LAB_003b6a90:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (((p->vType).pArray[lVar17] & 0xfcU) != 4) {
LAB_003b6ace:
        __assert_fail("Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
      }
      if ((p->vFanin).nSize <= iVar14) {
LAB_003b6aaf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar14 = (p->vFanin).pArray[lVar17];
      if (((long)iVar14 < 0) || ((p->vCopy).nSize <= iVar14)) goto LAB_003b6aaf;
      Vec_IntPush(vSigs,(p->vCopy).pArray[iVar14]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vOutputs).nSize);
  }
  return;
}

Assistant:

void Bac_NtkCollapse_rec( Bac_Ntk_t * pNew, Bac_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, iObj, iObjNew, iTerm;
    Bac_NtkStartCopies( p );
    // set PI copies
    assert( Vec_IntSize(vSigs) == Bac_NtkPiNum(p) );
    Bac_NtkForEachPi( p, iObj, i )
        Bac_ObjSetCopy( p, iObj, Vec_IntEntry(vSigs, i) );
    // duplicate internal objects and create buffers for hierarchy instances
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjIsBoxPrim( p, iObj ) )
            Bac_BoxDup( pNew, p, iObj );
        else
        {
            Bac_BoxForEachBo( p, iObj, iTerm, i )
            {
                iObjNew = Bac_ObjAlloc( pNew, BAC_OBJ_BI,  -1 );
                iObjNew = Bac_ObjAlloc( pNew, BAC_BOX_BUF, -1 ); // buffer
                iObjNew = Bac_ObjAlloc( pNew, BAC_OBJ_BO,  -1 );
                Bac_ObjSetCopy( p, iTerm, iObjNew );
            }
        }
    // duplicate user modules and connect objects
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjIsBoxPrim( p, iObj ) )
        {
            Bac_BoxForEachBi( p, iObj, iTerm, i )
                Bac_ObjSetFanin( pNew, Bac_ObjCopy(p, iTerm), Bac_ObjCopy(p, Bac_ObjFanin(p, iTerm)) );
        }
        else
        {
            Vec_IntClear( vSigs );
            Bac_BoxForEachBi( p, iObj, iTerm, i )
                Vec_IntPush( vSigs, Bac_ObjCopy(p, Bac_ObjFanin(p, iTerm)) );
            Bac_NtkCollapse_rec( pNew, Bac_BoxNtk(p, iObj), vSigs );
            assert( Vec_IntSize(vSigs) == Bac_BoxBoNum(p, iObj) );
            Bac_BoxForEachBo( p, iObj, iTerm, i )
                Bac_ObjSetFanin( pNew, Bac_ObjCopy(p, iTerm)-2, Vec_IntEntry(vSigs, i) );
        }
    // collect POs
    Vec_IntClear( vSigs );
    Bac_NtkForEachPo( p, iObj, i )
        Vec_IntPush( vSigs, Bac_ObjCopy(p, Bac_ObjFanin(p, iObj)) );
}